

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O2

Value __thiscall
MiniScript::Parser::ParseNot(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  int iVar1;
  ParseState *this_00;
  bool bVar2;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  Value VVar3;
  undefined1 local_128 [16];
  Lexer local_118;
  Lexer local_110;
  Lexer local_108;
  Value local_100;
  Value local_f0;
  Value local_e0;
  Token tok;
  Token local_b0;
  TACLine local_90;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  Lexer::Peek(&tok,this_01);
  *(undefined2 *)&(this->errorContext).ss = 0;
  *(undefined1 *)((long)&(this->errorContext).ss + 2) = 0;
  if (tok.type == Keyword) {
    bVar2 = String::operator==(&tok.text,"not");
    if (bVar2) {
      Lexer::Dequeue(&local_b0,this_01);
      String::~String(&local_b0.text);
      local_108.ls = this_01->ls;
      if (local_108.ls != (LexerStorage *)0x0) {
        (local_108.ls)->refCount = (local_108.ls)->refCount + 1;
      }
      AllowLineBreak(&local_108);
      Lexer::release(&local_108);
      local_110.ls = this_01->ls;
      if (local_110.ls != (LexerStorage *)0x0) {
        (local_110.ls)->refCount = (local_110.ls)->refCount + 1;
      }
      ParseIsA((Parser *)local_128,tokens,SUB81(&local_110,0),false);
      Value::operator=((Value *)this,(Value *)local_128);
      Value::~Value((Value *)local_128);
      Lexer::release(&local_110);
      this_00 = (ParseState *)tokens[6].ls;
      iVar1 = this_00->nextTempNum;
      this_00->nextTempNum = iVar1 + 1;
      local_100.type = Temp;
      local_100.noInvoke = false;
      local_100.localOnly = Off;
      local_100.data.tempNum = iVar1;
      Value::Value(&local_e0,(Value *)this);
      Value::Value(&local_f0,(Value *)Value::null);
      TACLine::TACLine(&local_90,&local_100,NotA,&local_e0,&local_f0);
      ParseState::Add(this_00,&local_90);
      TACLine::~TACLine(&local_90);
      Value::~Value(&local_f0);
      Value::~Value(&local_e0);
      Value::~Value(&local_100);
      local_128[0] = Temp;
      local_128[1] = false;
      local_128[2] = Off;
      local_128._8_4_ = iVar1;
      Value::operator=((Value *)this,(Value *)local_128);
      Value::~Value((Value *)local_128);
      goto LAB_00132ae4;
    }
  }
  local_118.ls = this_01->ls;
  if (local_118.ls != (LexerStorage *)0x0) {
    (local_118.ls)->refCount = (local_118.ls)->refCount + 1;
  }
  ParseIsA((Parser *)local_128,tokens,SUB81(&local_118,0),statementStart);
  Value::operator=((Value *)this,(Value *)local_128);
  Value::~Value((Value *)local_128);
  Lexer::release(&local_118);
LAB_00132ae4:
  String::~String(&tok.text);
  VVar3.data.number = extraout_RDX.number;
  VVar3._0_8_ = this;
  return VVar3;
}

Assistant:

Value Parser::ParseNot(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseIsA;
		Token tok = tokens.Peek();
		Value val;
		if (tok.type == Token::Type::Keyword and tok.text == "not") {
			tokens.Dequeue();		// discard "not"

			AllowLineBreak(tokens); // allow a line break after a unary operator
			
			val = (*this.*nextLevel)(tokens, false, false);
			int tempNum = output->nextTempNum++;
			output->Add(TACLine(Value::Temp(tempNum), TACLine::Op::NotA, val));
			val = Value::Temp(tempNum);
		} else {
			val = (*this.*nextLevel)(tokens, asLval, statementStart);
		}
		return val;
	}